

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O1

_Bool slice_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  ulong uVar1;
  _Bool _Var2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  _Bool _Var6;
  ulong uVar7;
  
  puVar3 = (undefined8 *)al_get_file_userdata(f);
  if (whence == 2) {
    lVar4 = puVar3[3];
  }
  else {
    if (whence != 1) {
      if (whence != 0) {
        return false;
      }
      lVar4 = puVar3[1];
      goto LAB_0015a41e;
    }
    lVar4 = puVar3[2];
  }
  lVar4 = lVar4 + puVar3[1];
LAB_0015a41e:
  uVar5 = lVar4 + offset;
  uVar1 = puVar3[1];
  uVar7 = uVar1;
  if (((uVar1 <= uVar5) && (uVar7 = uVar5, uVar1 + puVar3[3] < uVar5)) &&
     (uVar7 = uVar1 + puVar3[3], (*(byte *)(puVar3 + 4) & 4) != 0)) {
    uVar7 = uVar5;
  }
  _Var6 = false;
  _Var2 = al_fseek((ALLEGRO_FILE *)*puVar3,uVar7,0);
  if (_Var2) {
    uVar7 = uVar7 - puVar3[1];
    puVar3[2] = uVar7;
    _Var6 = true;
    if ((ulong)puVar3[3] < uVar7) {
      puVar3[3] = uVar7;
    }
  }
  return _Var6;
}

Assistant:

static bool slice_fseek(ALLEGRO_FILE *f, int64_t offset, int whence)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   
   if (whence == ALLEGRO_SEEK_SET) {
      offset = slice->anchor + offset;
   }
   else if (whence == ALLEGRO_SEEK_CUR) {
      offset = slice->anchor + slice->pos + offset;
   }
   else if (whence == ALLEGRO_SEEK_END) {
      offset = slice->anchor + slice->size + offset;
   }
   else {
      return false;
   }
   
   if ((size_t) offset < slice->anchor) {
      offset = slice->anchor;
   }
   else if ((size_t) offset > slice->anchor + slice->size) {
      if (!(slice->mode & SLICE_EXPANDABLE)) {
         offset = slice->anchor + slice->size;
      }
   }
   
   if (al_fseek(slice->fp, offset, ALLEGRO_SEEK_SET)) {
      slice->pos = offset - slice->anchor;
      if (slice->pos > slice->size)
         slice->size = slice->pos;
      return true;
   }
   
   return false;
}